

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  atomic<unsigned_long> *paVar1;
  size_t __n;
  NucleicAcid *pNVar2;
  double dVar3;
  uint32_t *__fn;
  pointer puVar4;
  pointer pOVar5;
  element_type *peVar6;
  bool bVar7;
  int iVar8;
  uint32_t chain;
  uint32_t gap;
  undefined4 extraout_var;
  long lVar9;
  ostream *poVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  pointer pTVar16;
  Overlap *jt;
  pointer pOVar17;
  uint uVar18;
  char *pcVar19;
  undefined4 in_register_0000003c;
  char **__args;
  pointer puVar20;
  future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_> *this;
  char local_1d6;
  bool minhash;
  __atomic_base<unsigned_int> local_1d4;
  double local_1d0;
  pointer local_1c8;
  int local_1bc;
  long *local_1b8;
  long local_1b0;
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  sequences;
  ProgressBar bar;
  unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
  tparser;
  uint32_t num_threads;
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  targets;
  vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
  futures;
  double local_e8;
  vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> local_e0;
  shared_ptr<thread_pool::ThreadPool> thread_pool;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input_paths;
  packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()> local_a0;
  shared_ptr<thread_pool::ThreadPool> local_90;
  MinimizerEngine minimizer_engine;
  
  minhash = false;
  num_threads = 1;
  input_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  input_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = getopt_long(CONCAT44(in_register_0000003c,argc),argv,"k:w:f:t:h",
                      (anonymous_namespace)::options,0);
  iVar8 = iVar8 << 0x18;
  if (iVar8 == -0x1000000) {
    local_1d0 = (double)CONCAT44(local_1d0._4_4_,0xf);
    local_1b0 = CONCAT44(local_1b0._4_4_,5);
    local_1d4._M_i = 500;
    chain = 4;
    local_1c8 = (pointer)0x64;
    gap = 10000;
    local_e8 = 0.001;
  }
  else {
    local_e8 = 0.001;
    gap = 10000;
    local_1c8 = (pointer)0x64;
    chain = 4;
    local_1d4._M_i = 500;
    local_1b0 = CONCAT44(local_1b0._4_4_,5);
    local_1d0 = (double)CONCAT44(local_1d0._4_4_,0xf);
    do {
      switch(iVar8 >> 0x18) {
      case 0x62:
        local_1d4._M_i = atoi(_optarg);
        break;
      case 99:
        chain = atoi(_optarg);
        break;
      case 100:
      case 0x65:
      case 0x69:
      case 0x6a:
      case 0x6c:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x75:
switchD_00104c52_caseD_64:
        iVar8 = 1;
        goto LAB_00105c25;
      case 0x66:
        local_e8 = atof(_optarg);
        break;
      case 0x67:
        gap = atoi(_optarg);
        break;
      case 0x68:
        goto switchD_00104c52_caseD_68;
      case 0x6b:
        iVar8 = atoi(_optarg);
        local_1d0 = (double)CONCAT44(local_1d0._4_4_,iVar8);
        break;
      case 0x6d:
        iVar8 = atoi(_optarg);
        local_1c8 = (pointer)CONCAT44(extraout_var,iVar8);
        break;
      case 0x74:
        num_threads = atoi(_optarg);
        break;
      case 0x76:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2.2.0",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        goto LAB_00104d2b;
      case 0x77:
        iVar8 = atoi(_optarg);
        local_1b0 = CONCAT44(local_1b0._4_4_,iVar8);
        break;
      default:
        if (iVar8 >> 0x18 != 0x4d) goto switchD_00104c52_caseD_64;
        minhash = true;
      }
      iVar8 = getopt_long(argc,argv,"k:w:f:t:h",(anonymous_namespace)::options,0);
      iVar8 = iVar8 << 0x18;
    } while (iVar8 != -0x1000000);
  }
  if (argc == 1) {
switchD_00104c52_caseD_68:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "usage: ram [options ...] <target> [<sequences>]\n\n  # default output is stdout\n  <target>/<sequences> \n    input file in FASTA/FASTQ format (can be compressed with gzip)\n\n  options:\n    -k, --kmer-length <int>\n      default: 15\n      length of minimizers\n    -w, --window-length <int>\n      default: 5\n      length of sliding window from which minimizers are sampled\n    -f, --frequency-threshold <float>\n      default: 0.001\n      threshold for ignoring most frequent minimizers\n    --bandwidth <int>\n      default: 500\n      size of bandwidth in which minimizer hits can be chained\n    --chain <int>\n      default: 4\n      minimal number of chained minimizer hits in overlap\n    --matches <int>\n      default: 100\n      minimal number of matching bases in overlap\n    --gap <int>\n      default: 10000\n      maximal gap between minimizer hits in a chain\n    --minhash\n      use only a portion of all minimizers\n    -t, --threads <int>\n      default: 1\n      number of threads\n    --version\n      prints the version number\n    -h, --help\n      prints the usage\n"
               ,0x424);
LAB_00104d2b:
    iVar8 = 0;
    goto LAB_00105c25;
  }
  if (_optind < argc) {
    __args = argv + _optind;
    iVar8 = argc - _optind;
    do {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&input_paths,
                 __args);
      __args = __args + 1;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if (input_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      input_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[ram::] error: missing target file",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    iVar8 = 1;
    std::ostream::flush();
    goto LAB_00105c25;
  }
  anon_unknown.dwarf_1a61f::CreateParser
            ((anon_unknown_dwarf_1a61f *)&tparser,
             input_paths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if ((__uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
       )tparser._M_t.
        super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
        .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
       )0x0) {
    iVar8 = 1;
  }
  else {
    local_1d6 = '\0';
    if ((ulong)((long)input_paths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)input_paths.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      anon_unknown.dwarf_1a61f::CreateParser
                ((anon_unknown_dwarf_1a61f *)&minimizer_engine,
                 input_paths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      local_1b8 = (long *)minimizer_engine._0_8_;
LAB_00104e85:
      local_1d6 = true;
LAB_00104eea:
      thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<thread_pool::ThreadPool,std::allocator<thread_pool::ThreadPool>,unsigned_int&>
                (&thread_pool.
                  super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(ThreadPool **)&thread_pool,
                 (allocator<thread_pool::ThreadPool> *)&minimizer_engine,&num_threads);
      local_90.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_90.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ram::MinimizerEngine::MinimizerEngine
                (&minimizer_engine,&local_90,local_1d0._0_4_,(uint32_t)local_1b0,local_1d4._M_i,
                 chain,(uint32_t)local_1c8,gap);
      if (local_90.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_1d0 = 0.0;
      local_1bc = 0;
      do {
        lVar9 = std::chrono::_V2::steady_clock::now();
        targets.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        targets.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        targets.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (**(code **)(*(long *)tparser._M_t.
                              super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                              .
                              super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>
                              ._M_head_impl + 0x10))
                  (&sequences,
                   tparser._M_t.
                   super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                   .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>.
                   _M_head_impl,0x100000000,1);
        bar.bar_.field_2._M_allocated_capacity =
             (size_type)
             targets.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        bar.bar_._M_string_length =
             (size_type)
             targets.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        bar.bar_._M_dataplus._M_p =
             (pointer)targets.
                      super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        targets.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             sequences.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        targets.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             sequences.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        targets.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             sequences.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sequences.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sequences.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sequences.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                   *)&bar);
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector(&sequences);
        if (targets.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            targets.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar8 = 9;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[ram::] parsed ",0xf);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," targets ",9);
          *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xfffffefb | 4;
          if (lVar9 == 0) {
            dVar3 = 0.0;
          }
          else {
            lVar11 = std::chrono::_V2::steady_clock::now();
            dVar3 = (double)(lVar11 - lVar9) / 1000000000.0;
            local_1d0 = local_1d0 + dVar3;
          }
          poVar10 = std::ostream::_M_insert<double>(dVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"s",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          lVar9 = std::chrono::_V2::steady_clock::now();
          ram::MinimizerEngine::Minimize
                    (&minimizer_engine,
                     (const_iterator)
                     targets.
                     super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (const_iterator)
                     targets.
                     super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,minhash);
          ram::MinimizerEngine::Filter(&minimizer_engine,local_e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[ram::] minimized targets ",0x1a);
          *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
               *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
          if (lVar9 == 0) {
            dVar3 = 0.0;
          }
          else {
            lVar11 = std::chrono::_V2::steady_clock::now();
            dVar3 = (double)(lVar11 - lVar9) / 1000000000.0;
            local_1d0 = local_1d0 + dVar3;
          }
          poVar10 = std::ostream::_M_insert<double>(dVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"s",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          local_1d4 = biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>._M_i;
          LOCK();
          biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>._M_i =
               (__atomic_base<unsigned_int>)0;
          UNLOCK();
          do {
            local_1b0 = std::chrono::_V2::steady_clock::now();
            sequences.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sequences.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            sequences.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (**(code **)(*local_1b8 + 0x10))(&futures,local_1b8,0x40000000,1);
            bar.bar_.field_2._M_allocated_capacity =
                 (size_type)
                 sequences.
                 super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            bar.bar_._M_string_length =
                 (size_type)
                 sequences.
                 super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            bar.bar_._M_dataplus._M_p =
                 (pointer)sequences.
                          super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            sequences.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)futures.
                          super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            sequences.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)futures.
                          super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            sequences.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)futures.
                          super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            futures.
            super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            futures.
            super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            futures.
            super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                       *)&bar);
            std::
            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                       *)&futures);
            puVar4 = sequences.
                     super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (sequences.
                super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                sequences.
                super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              iVar8 = 0xb;
            }
            else {
              futures.
              super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              futures.
              super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              futures.
              super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              puVar20 = sequences.
                        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                peVar6 = thread_pool.
                         super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                bar.bar_._M_dataplus._M_p = (pointer)&minimizer_engine;
                if ((local_1d6 != '\x01') ||
                   (((puVar20->_M_t).
                     super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                     .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->id <
                    local_1d4._M_i)) {
                  bar.bar_._M_string_length = (size_type)&local_1d6;
                  bar.bar_.field_2._M_allocated_capacity = (size_type)&minhash;
                  bar.bar_.field_2._8_8_ = puVar20;
                  local_1c8 = (pointer)operator_new(0x20);
                  local_1c8->lhs_end = 1;
                  local_1c8->rhs_id = 1;
                  *(undefined ***)&local_1c8->lhs_id = &PTR___Sp_counted_ptr_inplace_001197a8;
                  __fn = &local_1c8->rhs_begin;
                  std::
                  __create_task_state<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>(),std::_Bind<main::__0(std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>)>,std::allocator<int>>
                            ((_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_lbcb_sci[P]ram_src_main_cpp:241:13)_(std::reference_wrapper<const_std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>)>
                              *)__fn,(allocator<int> *)&bar);
                  std::
                  packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>
                  ::get_future(&local_a0);
                  local_e0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                  _M_impl.super__Vector_impl_data._M_finish = local_1c8;
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_1c8->lhs_end = local_1c8->lhs_end + 1;
                    UNLOCK();
                  }
                  else {
                    local_1c8->lhs_end = local_1c8->lhs_end + 1;
                  }
                  LOCK();
                  paVar1 = &peVar6->task_id_;
                  uVar14 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
                  (paVar1->super___atomic_base<unsigned_long>)._M_i =
                       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
                  UNLOCK();
                  pTVar16 = (peVar6->queues_).
                            super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar9 = (long)(peVar6->queues_).
                                super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar16;
                  local_e0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)__fn;
                  if (lVar9 != 0) {
                    lVar9 = lVar9 >> 4;
                    lVar11 = 0;
                    do {
                      uVar13 = (uVar14 + lVar11) % (ulong)(lVar9 * 0x2e8ba2e8ba2e8ba3);
                      bar.bar_._M_dataplus._M_p = (pointer)&pTVar16[uVar13].mutex;
                      iVar8 = pthread_mutex_trylock((pthread_mutex_t *)bar.bar_._M_dataplus._M_p);
                      bar.bar_._M_string_length =
                           CONCAT71(bar.bar_._M_string_length._1_7_,iVar8 == 0);
                      if (iVar8 == 0) {
                        std::
                        queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
                        ::
                        emplace<thread_pool::ThreadPool::Submit<main::__0,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>>(main::__0&&,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>&&)::_lambda()_1_&>
                                  ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
                                    *)(pTVar16 + uVar13),(anon_class_16_1_8991e283 *)&local_e0);
                        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&bar);
                        std::condition_variable::notify_one();
                        goto LAB_0010555a;
                      }
                      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&bar);
                      lVar11 = lVar11 + 1;
                      pTVar16 = (peVar6->queues_).
                                super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar9 = (long)(peVar6->queues_).
                                    super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar16 >> 4;
                    } while (lVar11 != lVar9 * -0x5d1745d1745d1742);
                  }
                  pTVar16 = (peVar6->queues_).
                            super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar14 = uVar14 % (ulong)(((long)(peVar6->queues_).
                                                                                                      
                                                  super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pTVar16 >> 4) * 0x2e8ba2e8ba2e8ba3);
                  bar.bar_._M_dataplus._M_p = (pointer)&pTVar16[uVar14].mutex;
                  bar.bar_._M_string_length = bar.bar_._M_string_length & 0xffffffffffffff00;
                  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&bar);
                  bar.bar_._M_string_length = CONCAT71(bar.bar_._M_string_length._1_7_,1);
                  std::
                  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
                  ::
                  emplace<thread_pool::ThreadPool::Submit<main::__0,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>>(main::__0&&,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>&&)::_lambda()_1_&>
                            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
                              *)(pTVar16 + uVar14),(anon_class_16_1_8991e283 *)&local_e0);
                  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&bar);
                  std::condition_variable::notify_one();
LAB_0010555a:
                  if (local_e0.
                      super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_e0.
                               super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8);
                  std::
                  vector<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>,std::allocator<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>>
                  ::
                  emplace_back<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>
                            ((vector<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>,std::allocator<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>>
                              *)&futures,
                             (future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>
                              *)&local_a0);
                  if (local_a0._M_state.
                      super___shared_ptr<std::__future_base::_Task_state_base<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_a0._M_state.
                               super___shared_ptr<std::__future_base::_Task_state_base<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                }
                puVar20 = puVar20 + 1;
              } while (puVar20 != puVar4);
              uVar14 = (ulong)((long)futures.
                                     super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)futures.
                                    super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4;
              uVar15 = (uint)uVar14;
              uVar18 = 0x10;
              if (uVar15 < 0x10) {
                uVar18 = uVar15;
              }
              bar.bar_._M_dataplus._M_p = (pointer)&bar.bar_.field_2;
              std::__cxx11::string::_M_construct((ulong)&bar,(char)uVar18 + (uVar18 == 0));
              bar.bar_ptr_ = 0;
              bar.event_counter_ = 0;
              bar.events_per_tick_ =
                   (double)(uVar14 & 0xffffffff) /
                   (((double)CONCAT44(0x45300000,(int)(bar.bar_._M_string_length >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)bar.bar_._M_string_length) - 4503599627370496.0
                   ));
              local_1c8 = (pointer)futures.
                                   super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
              bar.num_events_ = uVar15;
              if (futures.
                  super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  futures.
                  super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar18 = (((targets.
                            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                          .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->id;
                uVar15 = (((sequences.
                            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                          .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->id;
                this = futures.
                       super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                do {
                  std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>::
                  get(&local_e0,this);
                  pOVar5 = local_e0.
                           super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                  for (pOVar17 = local_e0.
                                 super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pOVar17 != pOVar5;
                      pOVar17 = pOVar17 + 1) {
                    pNVar2 = sequences.
                             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [(ulong)pOVar17->lhs_id - (ulong)uVar15]._M_t.
                             super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                             .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl;
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(pNVar2->name)._M_dataplus._M_p,
                                         (pNVar2->name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    pcVar19 = "-";
                    if (pOVar17->strand != false) {
                      pcVar19 = "+";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar19,1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    pNVar2 = targets.
                             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [(ulong)pOVar17->rhs_id - (ulong)uVar18]._M_t.
                             super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                             .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl;
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar10,(pNVar2->name)._M_dataplus._M_p,
                                         (pNVar2->name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                    plVar12 = (long *)std::ostream::operator<<((ostream *)poVar10,0xff);
                    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                    std::ostream::put((char)plVar12);
                    std::ostream::flush();
                  }
                  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
                            (&local_e0);
                  bVar7 = biosoup::ProgressBar::operator++(&bar);
                  if (bVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"[ram::] mapped ",0xf);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10," sequences ",0xb);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar10,bar.bar_._M_dataplus._M_p,bar.bar_._M_string_length
                                        );
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] ",2);
                    lVar9 = local_1b0;
                    *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
                         *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) &
                         0xfffffefb | 4;
                    if (local_1b0 == 0) {
                      dVar3 = 0.0;
                    }
                    else {
                      lVar11 = std::chrono::_V2::steady_clock::now();
                      dVar3 = (double)(lVar11 - lVar9) / 1000000000.0;
                    }
                    poVar10 = std::ostream::_M_insert<double>(dVar3);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"s",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\r",1);
                  }
                  this = this + 1;
                } while ((pointer)this != local_1c8);
              }
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
              lVar9 = local_1b0;
              std::ostream::put('8');
              std::ostream::flush();
              if (lVar9 != 0) {
                lVar11 = std::chrono::_V2::steady_clock::now();
                local_1d0 = local_1d0 + (double)(lVar11 - lVar9) / 1000000000.0;
              }
              if ((local_1d6 != '\x01') ||
                 (iVar8 = 0xb,
                 (uint)biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>._M_i <
                 local_1d4._M_i)) {
                iVar8 = 0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)bar.bar_._M_dataplus._M_p != &bar.bar_.field_2) {
                operator_delete(bar.bar_._M_dataplus._M_p);
              }
              std::
              vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
              ::~vector(&futures);
            }
            std::
            vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ::~vector(&sequences);
            plVar12 = local_1b8;
          } while (iVar8 == 0);
          if (iVar8 == 0xb) {
            gzseek(local_1b8[2],0,0);
            plVar12[6] = 0;
            LOCK();
            biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>._M_i =
                 (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)local_1d4._M_i;
            UNLOCK();
            iVar8 = 0;
          }
        }
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector(&targets);
      } while (iVar8 == 0);
      if (iVar8 == 9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[ram::] ",8);
        poVar10 = std::ostream::_M_insert<double>(local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"s",1);
        local_1bc = 0;
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      ram::MinimizerEngine::~MinimizerEngine(&minimizer_engine);
      iVar8 = local_1bc;
      if (thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (thread_pool.
                   super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        iVar8 = local_1bc;
      }
    }
    else {
      anon_unknown.dwarf_1a61f::CreateParser
                ((anon_unknown_dwarf_1a61f *)&minimizer_engine,
                 input_paths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      local_1b8 = (long *)minimizer_engine._0_8_;
      if (minimizer_engine._0_8_ != 0) {
        __n = (input_paths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
        if (__n == input_paths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length) {
          if (__n == 0) goto LAB_00104e85;
          iVar8 = bcmp(((input_paths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                       input_paths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,__n);
          local_1d6 = iVar8 == 0;
        }
        else {
          local_1d6 = false;
        }
        goto LAB_00104eea;
      }
      iVar8 = 1;
    }
    if (local_1b8 != (long *)0x0) {
      (**(code **)(*local_1b8 + 8))();
    }
  }
  if ((__uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
       )tparser._M_t.
        super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
        .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
       )0x0) {
    (**(code **)(*(long *)tparser._M_t.
                          super___uniq_ptr_impl<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
                          .super__Head_base<0UL,_bioparser::Parser<biosoup::NucleicAcid>_*,_false>.
                          _M_head_impl + 8))();
  }
LAB_00105c25:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&input_paths);
  return iVar8;
}

Assistant:

int main(int argc, char** argv) {
  std::uint32_t k = 15;
  std::uint32_t w = 5;
  std::uint32_t bandwidth = 500;
  std::uint32_t chain = 4;
  std::uint32_t matches = 100;
  std::uint32_t gap = 10000;
  double frequency = 0.001;
  bool minhash = false;
  std::uint32_t num_threads = 1;

  std::vector<std::string> input_paths;

  const char* optstr = "k:w:f:t:h";
  char arg;
  while ((arg = getopt_long(argc, argv, optstr, options, nullptr)) != -1) {
    switch (arg) {
      case 'k': k = std::atoi(optarg); break;
      case 'w': w = std::atoi(optarg); break;
      case 'b': bandwidth = std::atoi(optarg); break;
      case 'c': chain = std::atoi(optarg); break;
      case 'm': matches = std::atoi(optarg); break;
      case 'g': gap = std::atoi(optarg); break;
      case 'f': frequency = std::atof(optarg); break;
      case 'M': minhash = true; break;
      case 't': num_threads = std::atoi(optarg); break;
      case 'v': std::cout << VERSION << std::endl; return 0;
      case 'h': Help(); return 0;
      default: return 1;
    }
  }

  if (argc == 1) {
    Help();
    return 0;
  }

  for (auto i = optind; i < argc; ++i) {
    input_paths.emplace_back(argv[i]);
  }

  if (input_paths.empty()) {
    std::cerr << "[ram::] error: missing target file" << std::endl;
    return 1;
  }

  auto tparser = CreateParser(input_paths[0]);
  if (tparser == nullptr) {
    return 1;
  }

  bool is_ava = false;
  std::unique_ptr<bioparser::Parser<biosoup::NucleicAcid>> sparser = nullptr;
  if (input_paths.size() > 1) {
    sparser = CreateParser(input_paths[1]);
    if (sparser == nullptr) {
      return 1;
    }
    is_ava = input_paths[0] == input_paths[1];
  } else {
    sparser = CreateParser(input_paths[0]);
    is_ava = true;
  }

  auto thread_pool = std::make_shared<thread_pool::ThreadPool>(num_threads);
  ram::MinimizerEngine minimizer_engine{
      thread_pool,
      k,
      w,
      bandwidth,
      chain,
      matches,
      gap};

  biosoup::Timer timer{};

  while (true) {
    timer.Start();

    std::vector<std::unique_ptr<biosoup::NucleicAcid>> targets;
    try {
      targets = tparser->Parse(1ULL << 32);
    } catch (std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }

    if (targets.empty()) {
      break;
    }

    std::cerr << "[ram::] parsed " << targets.size() << " targets "
              << std::fixed << timer.Stop() << "s"
              << std::endl;

    timer.Start();

    minimizer_engine.Minimize(targets.begin(), targets.end(), minhash);
    minimizer_engine.Filter(frequency);

    std::cerr << "[ram::] minimized targets "
              << std::fixed << timer.Stop() << "s"
              << std::endl;

    std::uint64_t num_targets = biosoup::NucleicAcid::num_objects;
    biosoup::NucleicAcid::num_objects = 0;

    while (true) {
      timer.Start();

      std::vector<std::unique_ptr<biosoup::NucleicAcid>> sequences;
      try {
        sequences = sparser->Parse(1U << 30);
      } catch (std::invalid_argument& exception) {
        std::cerr << exception.what() << std::endl;
        return 1;
      }

      if (sequences.empty()) {
        break;
      }

      std::vector<std::future<std::vector<biosoup::Overlap>>> futures;
      for (const auto& it : sequences) {
        if (is_ava && it->id >= num_targets) {
          continue;
        }
        futures.emplace_back(thread_pool->Submit(
            [&] (const std::unique_ptr<biosoup::NucleicAcid>& sequence)
                -> std::vector<biosoup::Overlap> {
              return minimizer_engine.Map(sequence, is_ava, is_ava, minhash);
            },
            std::ref(it)));
      }

      biosoup::ProgressBar bar{
          static_cast<std::uint32_t>(futures.size()), 16};

      std::uint64_t rhs_offset = targets.front()->id;
      std::uint64_t lhs_offset = sequences.front()->id;
      for (auto& it : futures) {
        for (const auto& jt : it.get()) {
          std::cout << sequences[jt.lhs_id - lhs_offset]->name << "\t"
                    << sequences[jt.lhs_id - lhs_offset]->inflated_len << "\t"
                    << jt.lhs_begin << "\t"
                    << jt.lhs_end << "\t"
                    << (jt.strand ? "+" : "-") << "\t"
                    << targets[jt.rhs_id - rhs_offset]->name << "\t"
                    << targets[jt.rhs_id - rhs_offset]->inflated_len << "\t"
                    << jt.rhs_begin << "\t"
                    << jt.rhs_end << "\t"
                    << jt.score << "\t"
                    << std::max(
                          jt.lhs_end - jt.lhs_begin,
                          jt.rhs_end - jt.rhs_begin) << "\t"
                    << 255
                    << std::endl;
        }

        if (++bar) {
          std::cerr << "[ram::] mapped " << bar.event_counter() << " sequences "
                    << "[" << bar << "] "
                    << std::fixed << timer.Lap() << "s"
                    << "\r";
        }
      }
      std::cerr << std::endl;
      timer.Stop();

      if (is_ava && biosoup::NucleicAcid::num_objects >= num_targets) {
        break;
      }
    }

    sparser->Reset();
    biosoup::NucleicAcid::num_objects = num_targets;
  }

  std::cerr << "[ram::] " << timer.elapsed_time() << "s" << std::endl;

  return 0;
}